

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strstr.c
# Opt level: O1

char * strstr(char *__haystack,char *__needle)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char *p1;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  
  if (*__haystack != '\0') {
    cVar3 = *__needle;
    pcVar4 = __haystack;
    do {
      if (cVar3 == '\0') {
        return __haystack;
      }
      bVar6 = cVar3 == '\0';
      if (*pcVar4 == cVar3) {
        lVar5 = 1;
        do {
          pcVar1 = __needle + lVar5;
          bVar6 = *pcVar1 == '\0';
          if (bVar6) {
            return pcVar4;
          }
          pcVar2 = pcVar4 + lVar5;
          lVar5 = lVar5 + 1;
        } while (*pcVar2 == *pcVar1);
      }
      if (bVar6) {
        return pcVar4;
      }
      pcVar1 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    } while (*pcVar1 != '\0');
  }
  return (char *)0x0;
}

Assistant:

char * strstr( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *s1 )
    {
        p2 = s2;

        while ( *p2 && ( *p1 == *p2 ) )
        {
            ++p1;
            ++p2;
        }

        if ( ! *p2 )
        {
            return ( char * ) s1;
        }

        ++s1;
        p1 = s1;
    }

    return NULL;
}